

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> __thiscall
wabt::MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  string_view local_30;
  
  puVar4 = (undefined8 *)operator_new(0x78);
  local_30.data_ = (args_1->_M_dataplus)._M_p;
  local_30.size_ = args_1->_M_string_length;
  puVar4[1] = 0;
  puVar4[2] = 0;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[3] = (args->filename).data_;
  puVar4[4] = sVar1;
  puVar4[5] = sVar2;
  puVar4[6] = uVar3;
  *(undefined4 *)(puVar4 + 7) = 7;
  *puVar4 = &PTR__MemoryModuleField_002c6d80;
  string_view::to_string_abi_cxx11_((string *)(puVar4 + 8),&local_30);
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  *(undefined2 *)(puVar4 + 0xe) = 0;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}